

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void rmsub_stride(double *A,double *B,double *C,int rows,int cols,int p,int sA,int sB,int sC)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int cols_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)cols;
  uVar2 = (ulong)(uint)rows;
  while( true ) {
    uVar4 = uVar6 & 0xffffffff;
    iVar3 = (int)uVar6;
    iVar1 = (int)uVar2;
    if (iVar3 + iVar1 + p < 0xc1) break;
    uVar2 = (long)iVar1 / 2 & 0xffffffff;
    uVar6 = (long)iVar3 / 2;
    p = p / 2;
    cols_00 = (int)uVar6;
    iVar3 = (int)((long)iVar1 / 2);
    rmsub_stride(A,B,C,iVar3,cols_00,p,sA,sB,sC);
    rmsub_stride(A + cols_00,B + cols_00,C + cols_00,iVar3,cols_00,p,sA,sB,sC);
    rmsub_stride(A + iVar3 * sB,B + iVar3 * sC,C + iVar3 * sC,iVar3,cols_00,p,sA,sB,sC);
    A = A + iVar3 * sB + cols_00;
    B = B + iVar3 * sC + cols_00;
    C = C + iVar3 * sC + cols_00;
  }
  uVar6 = 0;
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  if (iVar1 < 1) {
    uVar2 = uVar6;
  }
  for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      C[uVar5] = A[uVar5] - B[uVar5];
    }
    A = A + sA;
    B = B + sB;
    C = C + sC;
  }
  return;
}

Assistant:

void rmsub_stride(double* A, double* B, double* C,int rows,int cols,int p,int sA,int sB,int sC) {
	int i,j,u,v,w;
	if (rows + cols + p <= CUTOFF) {
		for (i = 0; i < rows; ++i) {
			u = i * sC;
			v = i * sA;
			w = i * sB;
			for(j = 0; j < cols;j++) {
				C[j + u] = A[j + v] - B[j + w];
			}
		}
		
	 } else {
		 rows/=2;cols/=2;p/=2;
		 rmsub_stride(A,B,C,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + cols,B + cols,C + cols,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB,B + rows *sC,C + rows *sC,rows,cols,p,sA,sB,sC);
		 rmsub_stride(A + rows *sB + cols,B + rows *sC + cols,C + rows *sC + cols,rows,cols,p,sA,sB,sC);
	 }
}